

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::SetActiveDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,ActiveOperationalDataset *aDataset)

{
  anon_class_256_3_2539074c local_140;
  AsyncRequest local_40;
  ActiveOperationalDataset *local_20;
  ActiveOperationalDataset *aDataset_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_140.this = this;
  local_20 = aDataset;
  aDataset_local = (ActiveOperationalDataset *)aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_140.aHandler,aHandler);
  ActiveOperationalDataset::ActiveOperationalDataset(&local_140.aDataset,local_20);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)::__0,void>
            ((function<void()> *)&local_40,&local_140);
  PushAsyncRequest(this,&local_40);
  std::function<void_()>::~function(&local_40);
  SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_140);
  return;
}

Assistant:

void CommissionerSafe::SetActiveDataset(ErrorHandler aHandler, const ActiveOperationalDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetActiveDataset(aHandler, aDataset); });
}